

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void get_text_data_bss(GlobalVars *gv,LinkedSection **sections)

{
  LinkedSection *pLVar1;
  node *pnVar2;
  char *pcVar3;
  char *errtxt;
  
  *sections = (LinkedSection *)0x0;
  sections[1] = (LinkedSection *)0x0;
  sections[2] = (LinkedSection *)0x0;
  pLVar1 = (LinkedSection *)(gv->lnksec).first;
  pnVar2 = (pLVar1->n).next;
  do {
    if (pnVar2 == (node *)0x0) {
      return;
    }
    if ((pLVar1->flags & 1) != 0) {
      switch((ulong)pLVar1->type) {
      case 0:
        pLVar1->flags = pLVar1->flags & 0xfe;
        break;
      case 1:
        if (*sections == (LinkedSection *)0x0) {
          *sections = pLVar1;
        }
        else {
          pcVar3 = pLVar1->name;
          errtxt = "%sMultiple code sections (%s)";
LAB_001112de:
          ierror(errtxt,"get_text_data_bss(): ",pcVar3);
        }
        break;
      case 2:
        if (sections[1] != (LinkedSection *)0x0) {
          pcVar3 = pLVar1->name;
          errtxt = "%sMultiple data sections (%s)";
          goto LAB_001112de;
        }
        sections[1] = pLVar1;
        break;
      case 3:
        if (sections[2] != (LinkedSection *)0x0) {
          pcVar3 = pLVar1->name;
          errtxt = "%sMultiple bss sections (%s)";
          goto LAB_001112de;
        }
        sections[2] = pLVar1;
        break;
      default:
        ierror("%sIllegal section type %d (%s)","get_text_data_bss(): ",(ulong)pLVar1->type,
               pLVar1->name);
      }
    }
    pLVar1 = (LinkedSection *)(pLVar1->n).next;
    pnVar2 = (pLVar1->n).next;
  } while( true );
}

Assistant:

void get_text_data_bss(struct GlobalVars *gv,struct LinkedSection **sections)
/* find exactly one ST_CODE, ST_DATA and ST_UDATA section, which
   will become .text, .data and .bss */
{
  static const char *fn = "get_text_data_bss(): ";
  struct LinkedSection *ls;

  sections[0] = sections[1] = sections[2] = NULL;
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      switch (ls->type) {
        case ST_UNDEFINED:
          /* @@@ discard undefined sections - they are empty anyway */
          ls->flags &= ~SF_ALLOC;
          break;
        case ST_CODE:
          if (sections[0]==NULL)
            sections[0] = ls;
          else
            ierror("%sMultiple code sections (%s)",fn,ls->name);
          break;
        case ST_DATA:
          if (sections[1]==NULL)
            sections[1] = ls;
          else
            ierror("%sMultiple data sections (%s)",fn,ls->name);
          break;
        case ST_UDATA:
          if (sections[2]==NULL)
            sections[2] = ls;
          else
            ierror("%sMultiple bss sections (%s)",fn,ls->name);
          break;
        default:
          ierror("%sIllegal section type %d (%s)",fn,(int)ls->type,ls->name);
          break;
      }
    }
  }
}